

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

ssize_t __thiscall
CompressedXipReader::write(CompressedXipReader *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  element_type *peVar2;
  undefined4 in_register_00000034;
  size_t n_local;
  uint8_t *p_local;
  CompressedXipReader *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_memrd);
  if (!bVar1) {
    loadmemrd(this);
  }
  peVar2 = std::__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MemoryReader,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->_memrd);
  (*(peVar2->super_ReadWriter)._vptr_ReadWriter[3])
            (peVar2,CONCAT44(in_register_00000034,__fd),__buf);
  this->_pos = this->_pos + (int)__buf;
  return (ssize_t)this;
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        if (!_memrd)
            loadmemrd();

        _memrd->write(p, n);
        _pos += n;
    }